

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O2

void __thiscall CGameControllerCTF::Tick(CGameControllerCTF *this)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  CGameContext *pCVar4;
  CFlag *this_00;
  CFlag *pCVar5;
  CPlayer *pCVar6;
  IServer *pIVar7;
  IConsole *pIVar8;
  CCharacter *pChar;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  float fVar14;
  char aBuf_1 [256];
  char aBuf [64];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  IGameController::Tick(&this->super_IGameController);
  pCVar4 = (this->super_IGameController).m_pGameServer;
  if (((pCVar4->m_World).m_ResetRequested == false) && ((pCVar4->m_World).m_Paused == false)) {
    for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
      this_00 = this->m_apFlags[uVar11];
      if (this_00 != (CFlag *)0x0) {
        if (this_00->m_pCarrier == (CCharacter *)0x0) {
          uVar10 = CGameWorld::FindEntities
                             (&((this->super_IGameController).m_pGameServer)->m_World,
                              (this_00->super_CEntity).m_Pos,14.0,(CEntity **)aBuf,0x40,3);
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            lVar13 = *(long *)(aBuf + uVar12 * 8);
            if (((*(char *)(lVar13 + 0x40) == '\x01') &&
                (*(int *)(*(long *)(lVar13 + 0x38) + 0x408) != -1)) &&
               (iVar9 = CCollision::IntersectLine
                                  (&((this->super_IGameController).m_pGameServer)->m_Collision,
                                   (this_00->super_CEntity).m_Pos,*(vec2 *)(lVar13 + 0x30),
                                   (vec2 *)0x0,(vec2 *)0x0), iVar9 == 0)) {
              pChar = *(CCharacter **)(aBuf + uVar12 * 8);
              pCVar6 = pChar->m_pPlayer;
              if (pCVar6->m_Team != this_00->m_Team) {
                if (this_00->m_AtStand != false) {
                  piVar1 = (this->super_IGameController).m_aTeamscore + (uVar11 & 0xffffffff ^ 1);
                  *piVar1 = *piVar1 + 1;
                }
                CFlag::Grab(this_00,pChar);
                pCVar6 = this_00->m_pCarrier->m_pPlayer;
                piVar1 = &pCVar6->m_Score;
                *piVar1 = *piVar1 + 1;
                uVar10 = pCVar6->m_ClientID;
                pIVar7 = (this->super_IGameController).m_pServer;
                iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar10);
                str_format(aBuf_1,0x100,"flag_grab player=\'%d:%s\' team=%d",(ulong)uVar10,
                           CONCAT44(extraout_var_01,iVar9),
                           (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
                pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",aBuf_1,0);
                CGameContext::SendGameMsg
                          ((this->super_IGameController).m_pGameServer,8,(int)uVar11,-1);
                break;
              }
              if (this_00->m_AtStand == false) {
                pCVar6->m_Score = pCVar6->m_Score + 1;
                uVar2 = pCVar6->m_ClientID;
                pIVar7 = (this->super_IGameController).m_pServer;
                iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar2);
                str_format(aBuf_1,0x100,"flag_return player=\'%d:%s\' team=%d",(ulong)uVar2,
                           CONCAT44(extraout_var_00,iVar9),(ulong)(uint)pChar->m_pPlayer->m_Team);
                pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
                (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",aBuf_1,0);
                CGameContext::SendGameMsg((this->super_IGameController).m_pGameServer,5,-1);
                (*(this_00->super_CEntity)._vptr_CEntity[3])(this_00);
              }
            }
          }
        }
        else {
          uVar12 = uVar11 & 0xffffffff ^ 1;
          pCVar5 = this->m_apFlags[uVar12];
          if (((pCVar5 != (CFlag *)0x0) && (pCVar5->m_AtStand == true)) &&
             (fVar14 = distance<float>(&(this_00->super_CEntity).m_Pos,
                                       &(pCVar5->super_CEntity).m_Pos), fVar14 < 42.0)) {
            piVar1 = (this->super_IGameController).m_aTeamscore + uVar12;
            *piVar1 = *piVar1 + 100;
            pCVar6 = this_00->m_pCarrier->m_pPlayer;
            piVar1 = &pCVar6->m_Score;
            *piVar1 = *piVar1 + 5;
            pIVar7 = (this->super_IGameController).m_pServer;
            fVar14 = (float)(pIVar7->m_CurrentGameTick - this_00->m_GrabTick);
            uVar10 = pCVar6->m_ClientID;
            iVar9 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])(pIVar7,(ulong)uVar10);
            str_format(aBuf,0x40,"flag_capture player=\'%d:%s\' team=%d time=%.2f",
                       (double)(fVar14 / (float)((this->super_IGameController).m_pServer)->
                                                m_TickSpeed),(ulong)uVar10,
                       CONCAT44(extraout_var,iVar9),
                       (ulong)(uint)this_00->m_pCarrier->m_pPlayer->m_Team);
            pIVar8 = ((this->super_IGameController).m_pGameServer)->m_pConsole;
            (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,2,"game",aBuf,0);
            CGameContext::SendGameMsg
                      ((this->super_IGameController).m_pGameServer,9,(int)uVar11,
                       this_00->m_pCarrier->m_pPlayer->m_ClientID,(int)fVar14,-1);
            for (lVar13 = 0xdf; lVar13 != 0xe1; lVar13 = lVar13 + 1) {
              (**(code **)(**(long **)((this->super_IGameController).m_aTeamSize + lVar13 * 2 + -8)
                          + 0x18))();
            }
            iVar9 = (*(this->super_IGameController)._vptr_IGameController[1])(this);
            if ((char)iVar9 != '\0') goto LAB_0011bc2c;
          }
        }
      }
    }
    (*(this->super_IGameController)._vptr_IGameController[1])(this);
  }
LAB_0011bc2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameControllerCTF::Tick()
{
	IGameController::Tick();

	if(GameServer()->m_World.m_ResetRequested || GameServer()->m_World.m_Paused)
		return;

	for(int fi = 0; fi < 2; fi++)
	{
		CFlag *F = m_apFlags[fi];

		if(!F)
			continue;

		//
		if(F->GetCarrier())
		{
			if(m_apFlags[fi^1] && m_apFlags[fi^1]->IsAtStand())
			{
				if(distance(F->GetPos(), m_apFlags[fi^1]->GetPos()) < CFlag::ms_PhysSize + CCharacter::ms_PhysSize)
				{
					// CAPTURE! \o/
					m_aTeamscore[fi^1] += 100;
					F->GetCarrier()->GetPlayer()->m_Score += 5;
					float Diff = Server()->Tick() - F->GetGrabTick();

					char aBuf[64];
					str_format(aBuf, sizeof(aBuf), "flag_capture player='%d:%s' team=%d time=%.2f",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam(),
						Diff / (float)Server()->TickSpeed()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);

					GameServer()->SendGameMsg(GAMEMSG_CTF_CAPTURE, fi, F->GetCarrier()->GetPlayer()->GetCID(), Diff, -1);
					for(int i = 0; i < 2; i++)
						m_apFlags[i]->Reset();
					// do a win check(capture could trigger win condition)
					if(DoWincheckMatch())
						return;
				}
			}
		}
		else
		{
			CCharacter *apCloseCCharacters[MAX_CLIENTS];
			int Num = GameServer()->m_World.FindEntities(F->GetPos(), CFlag::ms_PhysSize, (CEntity**)apCloseCCharacters, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
			for(int i = 0; i < Num; i++)
			{
				if(!apCloseCCharacters[i]->IsAlive() || apCloseCCharacters[i]->GetPlayer()->GetTeam() == TEAM_SPECTATORS || GameServer()->Collision()->IntersectLine(F->GetPos(), apCloseCCharacters[i]->GetPos(), NULL, NULL))
					continue;

				if(apCloseCCharacters[i]->GetPlayer()->GetTeam() == F->GetTeam())
				{
					// return the flag
					if(!F->IsAtStand())
					{
						CCharacter *pChr = apCloseCCharacters[i];
						pChr->GetPlayer()->m_Score += 1;

						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "flag_return player='%d:%s' team=%d",
							pChr->GetPlayer()->GetCID(),
							Server()->ClientName(pChr->GetPlayer()->GetCID()),
							pChr->GetPlayer()->GetTeam()
						);
						GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
						GameServer()->SendGameMsg(GAMEMSG_CTF_RETURN, -1);
						F->Reset();
					}
				}
				else
				{
					// take the flag
					if(F->IsAtStand())
						m_aTeamscore[fi^1]++;

					F->Grab(apCloseCCharacters[i]);

					F->GetCarrier()->GetPlayer()->m_Score += 1;

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "flag_grab player='%d:%s' team=%d",
						F->GetCarrier()->GetPlayer()->GetCID(),
						Server()->ClientName(F->GetCarrier()->GetPlayer()->GetCID()),
						F->GetCarrier()->GetPlayer()->GetTeam()
					);
					GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
					GameServer()->SendGameMsg(GAMEMSG_CTF_GRAB, fi, -1);
					break;
				}
			}
		}
	}
	// do a win check(grabbing flags could trigger win condition)
	DoWincheckMatch();
}